

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::anon_unknown_0::UnderscoresToCamelCase
                   (string *__return_storage_ptr__,string *input,bool first_capitalized)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  ulong uVar6;
  char *pcVar7;
  reference pbVar8;
  size_type sVar9;
  long lVar10;
  int local_b0;
  int j;
  bool all_upper;
  string value;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  iterator i_1;
  bool first_segment_forces_upper;
  int local_60;
  char c;
  int i;
  bool last_char_was_upper;
  bool last_char_was_lower;
  bool last_char_was_number;
  string current;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  bool first_capitalized_local;
  string *input_local;
  string *result;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&current.field_2 + 8));
  std::__cxx11::string::string((string *)&i);
  bVar4 = false;
  bVar1 = false;
  bVar2 = false;
  for (local_60 = 0; uVar6 = std::__cxx11::string::size(), (ulong)(long)local_60 < uVar6;
      local_60 = local_60 + 1) {
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)input);
    cVar5 = *pcVar7;
    bVar3 = ascii_isdigit(cVar5);
    if (bVar3) {
      if (!bVar4) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&current.field_2 + 8),(value_type *)&i);
        std::__cxx11::string::operator=((string *)&i,"");
      }
      std::__cxx11::string::operator+=((string *)&i,cVar5);
      bVar2 = false;
      bVar1 = false;
      bVar4 = true;
    }
    else {
      bVar4 = ascii_islower(cVar5);
      if (bVar4) {
        if ((!bVar1) && (!bVar2)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&current.field_2 + 8),(value_type *)&i);
          std::__cxx11::string::operator=((string *)&i,"");
        }
        std::__cxx11::string::operator+=((string *)&i,cVar5);
        bVar2 = false;
        bVar1 = true;
      }
      else {
        bVar4 = ascii_isupper(cVar5);
        if (bVar4) {
          if (!bVar2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&current.field_2 + 8),(value_type *)&i);
            std::__cxx11::string::operator=((string *)&i,"");
          }
          cVar5 = ascii_tolower(cVar5);
          std::__cxx11::string::operator+=((string *)&i,cVar5);
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        bVar1 = false;
      }
      bVar4 = false;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&current.field_2 + 8),(value_type *)&i);
  i_1._M_current._3_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  i_1._M_current._2_1_ = 0;
  local_80._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&current.field_2 + 8));
  while( true ) {
    value.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&current.field_2 + 8));
    bVar4 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&value.field_2 + 8));
    if (!bVar4) break;
    pbVar8 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_80);
    std::__cxx11::string::string((string *)&j,(string *)pbVar8);
    sVar9 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(anonymous_namespace)::kUpperSegments_abi_cxx11_,(key_type *)&j);
    if ((sVar9 != 0) && (lVar10 = std::__cxx11::string::length(), lVar10 == 0)) {
      i_1._M_current._2_1_ = 1;
    }
    for (local_b0 = 0; uVar6 = std::__cxx11::string::length(), (ulong)(long)local_b0 < uVar6;
        local_b0 = local_b0 + 1) {
      if ((local_b0 == 0) || (sVar9 != 0)) {
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&j);
        cVar5 = ascii_toupper(*pcVar7);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&j);
        *pcVar7 = cVar5;
      }
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&j);
    std::__cxx11::string::~string((string *)&j);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_80);
  }
  lVar10 = std::__cxx11::string::length();
  if (((lVar10 != 0) && (!first_capitalized)) && ((i_1._M_current._2_1_ & 1) == 0)) {
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    cVar5 = ascii_tolower(*pcVar7);
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pcVar7 = cVar5;
  }
  i_1._M_current._3_1_ = 1;
  std::__cxx11::string::~string((string *)&i);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&current.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

string UnderscoresToCamelCase(const string& input, bool first_capitalized) {
  vector<string> values;
  string current;

  bool last_char_was_number = false;
  bool last_char_was_lower = false;
  bool last_char_was_upper = false;
  for (int i = 0; i < input.size(); i++) {
    char c = input[i];
    if (ascii_isdigit(c)) {
      if (!last_char_was_number) {
        values.push_back(current);
        current = "";
      }
      current += c;
      last_char_was_number = last_char_was_lower = last_char_was_upper = false;
      last_char_was_number = true;
    } else if (ascii_islower(c)) {
      // lowercase letter can follow a lowercase or uppercase letter
      if (!last_char_was_lower && !last_char_was_upper) {
        values.push_back(current);
        current = "";
      }
      current += c;  // already lower
      last_char_was_number = last_char_was_lower = last_char_was_upper = false;
      last_char_was_lower = true;
    } else if (ascii_isupper(c)) {
      if (!last_char_was_upper) {
        values.push_back(current);
        current = "";
      }
      current += ascii_tolower(c);
      last_char_was_number = last_char_was_lower = last_char_was_upper = false;
      last_char_was_upper = true;
    } else {
      last_char_was_number = last_char_was_lower = last_char_was_upper = false;
    }
  }
  values.push_back(current);

  string result;
  bool first_segment_forces_upper = false;
  for (vector<string>::iterator i = values.begin(); i != values.end(); ++i) {
    string value = *i;
    bool all_upper = (kUpperSegments.count(value) > 0);
    if (all_upper && (result.length() == 0)) {
      first_segment_forces_upper = true;
    }
    for (int j = 0; j < value.length(); j++) {
      if (j == 0 || all_upper) {
        value[j] = ascii_toupper(value[j]);
      } else {
        // Nothing, already in lower.
      }
    }
    result += value;
  }
  if ((result.length() != 0) &&
      !first_capitalized &&
      !first_segment_forces_upper) {
    result[0] = ascii_tolower(result[0]);
  }
  return result;
}